

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPLL.cpp
# Opt level: O0

int __thiscall Yamaha::OPL::OPLL::snare_drum(OPLL *this)

{
  int iVar1;
  LogSign local_18;
  LogSign snare;
  OPLL *this_local;
  
  snare = (LogSign)this;
  iVar1 = PhaseGenerator<9>::phase(this->phase_generators_ + 0x10);
  local_18 = WaveformGenerator<9>::snare(&this->oscillator_,iVar1);
  iVar1 = EnvelopeGenerator<7,_9>::attenuation(this->rhythm_envelope_generators_ + 3);
  LogSign::operator+=(&local_18,iVar1);
  LogSign::operator+=(&local_18,this->channels_[7].attenuation << 7);
  iVar1 = LogSign::level(&local_18,0);
  return iVar1;
}

Assistant:

int OPLL::snare_drum() {
	// Use modulator 7 and the carrier attenuation level for channel 7.
	LogSign snare = WaveformGenerator<period_precision>::snare(oscillator_, phase_generators_[7 + 9].phase());
	snare += rhythm_envelope_generators_[RhythmIndices::Snare].attenuation();
	snare += ATTENUATION(channels_[7].attenuation);
	return snare.level();
}